

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O0

void __thiscall
viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>::
rt_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_variable<1ul>>,viennamath::op_plus<double>,8l>
          (rt_binary_expr<viennamath::rt_expression_interface<double>> *this,
          ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_plus<double>,_viennamath::ct_constant<8L>_>
          *other)

{
  element_type *__p;
  rt_binary_expr<viennamath::rt_expression_interface<double>> *this_00;
  rt_constant<double,_viennamath::rt_expression_interface<double>_> *this_01;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_plus<double>,_viennamath::ct_constant<8L>_>
  *this_02;
  auto_ptr<viennamath::rt_expression_interface<double>_> local_50;
  rt_expression_interface<double> *local_48;
  ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
  local_3a;
  auto_ptr local_38 [8];
  rt_expression_interface<double> *local_30;
  internal_lhs_type *local_18;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_plus<double>,_viennamath::ct_constant<8L>_>
  *other_local;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *this_local;
  
  local_18 = &other->lhs_;
  other_local = (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_plus<double>,_viennamath::ct_constant<8L>_>
                 *)this;
  rt_expression_interface<double>::rt_expression_interface((rt_expression_interface<double> *)this);
  *(undefined ***)this = &PTR__rt_binary_expr_00128258;
  std::auto_ptr<viennamath::rt_expression_interface<double>_>::auto_ptr
            ((auto_ptr<viennamath::rt_expression_interface<double>_> *)(this + 8),
             (element_type *)0x0);
  __p = (element_type *)operator_new(8);
  __p->_vptr_op_interface = (_func_int **)0x0;
  op_binary<viennamath::op_plus<double>,_viennamath::rt_expression_interface<double>_>::op_binary
            ((op_binary<viennamath::op_plus<double>,_viennamath::rt_expression_interface<double>_> *
             )__p);
  std::auto_ptr<viennamath::op_interface<viennamath::rt_expression_interface<double>_>_>::auto_ptr
            ((auto_ptr<viennamath::op_interface<viennamath::rt_expression_interface<double>_>_> *)
             (this + 0x10),__p);
  this_02 = (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_plus<double>,_viennamath::ct_constant<8L>_>
             *)0x0;
  std::auto_ptr<viennamath::rt_expression_interface<double>_>::auto_ptr
            ((auto_ptr<viennamath::rt_expression_interface<double>_> *)(this + 0x18),
             (element_type *)0x0);
  this_00 = (rt_binary_expr<viennamath::rt_expression_interface<double>> *)operator_new(0x20);
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_plus<double>,_viennamath::ct_constant<8L>_>
  ::lhs(local_18,this_02);
  rt_binary_expr<0ul,viennamath::op_mult<double>,1ul>(this_00,&local_3a);
  std::auto_ptr<viennamath::rt_expression_interface<double>_>::auto_ptr
            ((auto_ptr<viennamath::rt_expression_interface<double>_> *)local_38,
             (element_type *)this_00);
  local_30 = (rt_expression_interface<double> *)
             std::auto_ptr::operator_cast_to_auto_ptr_ref(local_38);
  std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator=
            ((auto_ptr<viennamath::rt_expression_interface<double>_> *)(this + 8),
             (auto_ptr_ref<viennamath::rt_expression_interface<double>_>)local_30);
  std::auto_ptr<viennamath::rt_expression_interface<double>_>::~auto_ptr
            ((auto_ptr<viennamath::rt_expression_interface<double>_> *)local_38);
  this_01 = (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
  rt_constant<double,_viennamath::rt_expression_interface<double>_>::rt_constant(this_01,8.0);
  std::auto_ptr<viennamath::rt_expression_interface<double>_>::auto_ptr
            (&local_50,(element_type *)this_01);
  local_48 = (rt_expression_interface<double> *)
             std::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_50);
  std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator=
            ((auto_ptr<viennamath::rt_expression_interface<double>_> *)(this + 0x18),
             (auto_ptr_ref<viennamath::rt_expression_interface<double>_>)local_48);
  std::auto_ptr<viennamath::rt_expression_interface<double>_>::~auto_ptr(&local_50);
  return;
}

Assistant:

explicit rt_binary_expr(ct_binary_expr<LHS, OP, ct_constant<value> > const & other) : op_(new op_binary<OP, InterfaceType>())
      {
        //std::cout << "Constructing from expression " << other << std::endl;
        lhs_ = std::auto_ptr<InterfaceType>(new rt_binary_expr<InterfaceType>(other.lhs()));
        rhs_ = std::auto_ptr<InterfaceType>(new rt_constant<numeric_type, InterfaceType>(value));
      }